

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution::forward_int8(Convolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  undefined8 uVar5;
  int iVar12;
  char cVar13;
  int k;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  char cVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  size_type __n;
  int iVar21;
  int i;
  int iVar22;
  int iVar23;
  long lVar24;
  int q;
  ulong uVar25;
  float fVar26;
  float fVar27;
  float *local_168;
  int local_160;
  Mat bottom_blob_bordered;
  Mat m;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat bottom_blob_unbordered;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined3 uVar8;
  undefined1 uVar9;
  undefined2 uVar10;
  undefined1 uVar11;
  
  uVar1 = bottom_blob->c;
  uVar15 = (ulong)uVar1;
  sVar3 = bottom_blob->elemsize;
  iVar14 = this->kernel_w;
  iVar23 = this->dilation_w;
  iVar2 = this->kernel_h;
  iVar18 = this->dilation_h;
  Mat::Mat(&bottom_blob_unbordered,bottom_blob);
  if (sVar3 != 1) {
    bottom_blob_bordered.allocator = *(Allocator **)&opt->use_int8_arithmetic;
    bottom_blob_bordered.data = *(void **)opt;
    uVar5._0_1_ = opt->use_winograd_convolution;
    uVar5._1_1_ = opt->use_sgemm_convolution;
    uVar5._2_1_ = opt->use_int8_inference;
    uVar5._3_1_ = opt->use_vulkan_compute;
    uVar6 = opt->use_fp16_packed;
    uVar7 = opt->use_fp16_storage;
    uVar9 = opt->use_fp16_arithmetic;
    uVar11 = opt->use_int8_storage;
    uVar10 = CONCAT11(uVar11,uVar9);
    uVar8 = CONCAT21(uVar10,uVar7);
    uVar5._4_4_ = CONCAT31(uVar8,uVar6);
    bottom_blob_bordered.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
    bottom_blob_bordered.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    bottom_blob_bordered.elempack = (int)uVar5;
    bottom_blob_bordered.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    bottom_blob_bordered.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    bottom_blob_bordered._28_4_ = uVar5._4_4_;
    quantize_float32_to_int8
              (bottom_blob,&bottom_blob_unbordered,this->bottom_blob_int8_scale,
               (Option *)&bottom_blob_bordered);
  }
  bottom_blob_bordered.elemsize._0_4_ = 0;
  bottom_blob_bordered.elemsize._4_4_ = 0;
  bottom_blob_bordered.elempack = 0;
  bottom_blob_bordered.data = (void *)0x0;
  bottom_blob_bordered.refcount._0_4_ = 0;
  bottom_blob_bordered.refcount._4_4_ = 0;
  bottom_blob_bordered.allocator = (Allocator *)0x0;
  bottom_blob_bordered.dims = 0;
  bottom_blob_bordered.w = 0;
  bottom_blob_bordered.h = 0;
  bottom_blob_bordered.c = 0;
  bottom_blob_bordered.cstep = 0;
  make_padding(this,&bottom_blob_unbordered,&bottom_blob_bordered,opt);
  local_160 = -100;
  if ((bottom_blob_bordered.data != (void *)0x0) &&
     ((long)bottom_blob_bordered.c * bottom_blob_bordered.cstep != 0)) {
    iVar12 = bottom_blob_bordered.w;
    iVar4 = (~((iVar14 + -1) * iVar23) + bottom_blob_bordered.w) / this->stride_w;
    iVar2 = (~((iVar2 + -1) * iVar18) + bottom_blob_bordered.h) / this->stride_h;
    __n = (long)this->kernel_h * (long)this->kernel_w;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,__n,(allocator_type *)&m);
    iVar14 = this->dilation_h;
    iVar23 = this->kernel_w;
    iVar18 = this->dilation_w * iVar23;
    lVar19 = 0;
    iVar21 = 0;
    for (iVar22 = 0; iVar22 < this->kernel_h; iVar22 = iVar22 + 1) {
      for (lVar24 = 0; (int)lVar24 < iVar23; lVar24 = lVar24 + 1) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)lVar19 + lVar24] = iVar21;
        iVar21 = iVar21 + this->dilation_w;
        iVar23 = this->kernel_w;
      }
      iVar21 = iVar21 + (iVar12 * iVar14 - iVar18);
      lVar19 = (int)lVar19 + lVar24;
    }
    Mat::create(top_blob,iVar4 + 1,iVar2 + 1,this->num_output,
                ((ulong)this->use_int8_requantize ^ 1) * 3 + 1,opt->blob_allocator);
    local_160 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar20 = 0;
      if (0 < (int)__n) {
        uVar20 = __n & 0xffffffff;
      }
      local_160 = 0;
      if ((int)uVar1 < 1) {
        uVar15 = 0;
      }
      for (lVar19 = 0; lVar19 < this->num_output; lVar19 = lVar19 + 1) {
        Mat::channel(&m,top_blob,(int)lVar19);
        local_168 = (float *)m.data;
        Mat::~Mat(&m);
        for (iVar14 = 0; iVar14 <= iVar2; iVar14 = iVar14 + 1) {
          iVar23 = 0;
          while( true ) {
            if (iVar4 < iVar23) break;
            lVar24 = (long)(this->weight_data).data + (long)(int)((int)__n * uVar1 * (int)lVar19);
            iVar18 = 0;
            for (uVar25 = 0; uVar25 != uVar15; uVar25 = uVar25 + 1) {
              m.elemsize = CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                                    (undefined4)bottom_blob_bordered.elemsize);
              m.data = (void *)(bottom_blob_bordered.cstep * uVar25 * m.elemsize +
                               (long)bottom_blob_bordered.data);
              m.refcount = (int *)0x0;
              m.elempack = bottom_blob_bordered.elempack;
              m.allocator = bottom_blob_bordered.allocator;
              m.dims = 2;
              m.w = bottom_blob_bordered.w;
              m.h = bottom_blob_bordered.h;
              m.c = 1;
              m.cstep = (size_t)(bottom_blob_bordered.h * bottom_blob_bordered.w);
              for (uVar16 = 0; uVar20 != uVar16; uVar16 = uVar16 + 1) {
                iVar18 = iVar18 + (int)*(char *)(lVar24 + uVar16) *
                                  (int)*(char *)((long)m.data +
                                                (long)_space_ofs.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start
                                                      [uVar16] +
                                                (long)(bottom_blob_bordered.w * iVar14 *
                                                      this->stride_h) * m.elemsize +
                                                (long)iVar23 * (long)this->stride_w);
              }
              lVar24 = lVar24 + __n;
              Mat::~Mat(&m);
            }
            fVar26 = *(float *)((long)(this->weight_data_int8_scales).data + lVar19 * 4);
            fVar26 = (float)iVar18 *
                     (float)(~-(uint)(fVar26 == 0.0) &
                            (uint)(1.0 / (this->bottom_blob_int8_scale * fVar26)));
            if (this->use_int8_requantize == false) {
              if (this->bias_term != 0) {
                fVar26 = fVar26 + *(float *)((long)(this->bias_data).data + lVar19 * 4);
              }
              fVar27 = 0.0;
              if (0.0 <= fVar26) {
                fVar27 = fVar26;
              }
              if (this->activation_type != 1) {
                fVar27 = fVar26;
              }
              *local_168 = fVar27;
              lVar24 = 4;
            }
            else {
              if (this->bias_term != 0) {
                fVar26 = fVar26 + *(float *)((long)(this->bias_data).data + lVar19 * 4);
              }
              fVar26 = roundf(fVar26 * this->top_blob_int8_scale);
              iVar18 = (int)fVar26;
              if (iVar18 < -0x7e) {
                iVar18 = -0x7f;
              }
              if (0x7e < iVar18) {
                iVar18 = 0x7f;
              }
              cVar13 = (char)iVar18;
              cVar17 = '\0';
              if ('\0' < cVar13) {
                cVar17 = cVar13;
              }
              if (this->activation_type != 1) {
                cVar17 = cVar13;
              }
              *(char *)local_168 = cVar17;
              lVar24 = 1;
            }
            local_168 = (float *)((long)local_168 + lVar24);
            iVar23 = iVar23 + 1;
          }
        }
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
  }
  Mat::~Mat(&bottom_blob_bordered);
  Mat::~Mat(&bottom_blob_unbordered);
  return local_160;
}

Assistant:

int Convolution::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Convolution input %d x %d  ksize=%d %d  stride=%d %d\n", w, h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (elemsize != 1)
    {
        Option opt_g = opt;
        opt_g.blob_allocator = opt.workspace_allocator;

        quantize_float32_to_int8(bottom_blob, bottom_blob_unbordered, bottom_blob_int8_scale, opt_g);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_unbordered, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // int8
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        signed char* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                int sum = 0;

                const signed char* kptr = (const signed char*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        int val = sptr[ space_ofs[k] ];
                        int w = kptr[k];
                        sum += val * w;
                    }

                    kptr += maxk;
                }

                if (use_int8_requantize)
                {
                    // requantize and relu
                    float scale_in;
                    if (weight_data_int8_scales[p] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

                    float sumfp32 = sum * scale_in;

                    if (bias_term)
                        sumfp32 += bias_data[p];

                    float scale_out = top_blob_int8_scale;//FIXME load param

                    signed char sums8 = float2int8(sumfp32 * scale_out);

                    if (activation_type == 1)
                    {
                        sums8 = std::max(sums8, (signed char)0);
                    }

                    outptr[0] = sums8;
                    outptr += 1;
                }
                else
                {
                    // dequantize and relu
                    float scale_in;
                    if (weight_data_int8_scales[p] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

                    float sumfp32 = sum * scale_in;
                    if (bias_term)
                        sumfp32 += bias_data[p];

                    if (activation_type == 1)
                    {
                        sumfp32 = std::max(sumfp32, 0.f);
                    }

                    ((float*)outptr)[0] = sumfp32;
                    outptr += 4;
                }
            }
        }
    }

    return 0;
}